

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::LLVMDGDumpBlocks::dumpSubgraph
          (LLVMDGDumpBlocks *this,LLVMDependenceGraph *graph,char *name)

{
  bool bVar1;
  LLVMDGDumpBlocks *this_00;
  iterator blk;
  DependenceGraph<dg::LLVMNode> *in_RSI;
  _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_> *in_RDI;
  pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*> *B_1;
  iterator __end2_1;
  iterator __begin2_1;
  BBlocksMapT *__range2_1;
  pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*> *B;
  iterator __end2;
  iterator __begin2;
  BBlocksMapT *__range2;
  LLVMBBlock *in_stack_00000188;
  LLVMDGDumpBlocks *in_stack_00000190;
  map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
  *in_stack_ffffffffffffff98;
  _Self in_stack_ffffffffffffffb0;
  _Self in_stack_ffffffffffffffb8;
  DG2Dot<dg::LLVMNode> *in_stack_ffffffffffffffc0;
  _Self local_30;
  
  DG2Dot<dg::LLVMNode>::dumpSubgraphStart
            (in_stack_ffffffffffffffc0,
             (DependenceGraph<dg::LLVMNode> *)in_stack_ffffffffffffffb8._M_node,
             (char *)in_stack_ffffffffffffffb0._M_node);
  this_00 = (LLVMDGDumpBlocks *)DependenceGraph<dg::LLVMNode>::getBlocks(in_RSI);
  blk = std::
        map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
        ::begin(in_stack_ffffffffffffff98);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,&local_30);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::operator*
              ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_> *)
               0x1bd158);
    dumpBlock(in_stack_00000190,in_stack_00000188);
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::operator++
              (in_RDI);
  }
  DependenceGraph<dg::LLVMNode>::getBlocks(in_RSI);
  std::
  map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
  ::begin(in_stack_ffffffffffffff98);
  std::
  map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
  ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffb8,(_Self *)&stack0xffffffffffffffb0);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::operator*
              ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_> *)
               0x1bd1c8);
    dumpBlockEdges(this_00,(LLVMBBlock *)blk._M_node);
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::operator++
              (in_RDI);
  }
  DG2Dot<dg::LLVMNode>::dumpSubgraphEnd
            ((DG2Dot<dg::LLVMNode> *)name,(DependenceGraph<dg::LLVMNode> *)__range2,
             __begin2._M_node._7_1_);
  return;
}

Assistant:

void dumpSubgraph(LLVMDependenceGraph *graph, const char *name) {
        dumpSubgraphStart(graph, name);

        for (auto &B : graph->getBlocks()) {
            dumpBlock(B.second);
        }

        for (auto &B : graph->getBlocks()) {
            dumpBlockEdges(B.second);
        }

        dumpSubgraphEnd(graph, false);
    }